

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<long>::~RepeatedField(RepeatedField<long> *this)

{
  RepeatedField<long> *this_local;
  
  InternalDeallocate(this,this->rep_,this->total_size_);
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  // See explanation in Reserve(): we need to invoke destructors here for the
  // case that Element has a non-trivial destructor.
  InternalDeallocate(rep_, total_size_);
}